

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomDefs.c
# Opt level: O1

int get_roomdef(tgestate_t *state,room_t room_index,int offset)

{
  uint uVar1;
  uint8_t *puVar2;
  undefined7 in_register_00000031;
  
  uVar1 = get_roomdef_shadow((int)CONCAT71(in_register_00000031,room_index),offset);
  if ((int)uVar1 < 0) {
    puVar2 = (&PTR_anon_var_dwarf_b165_0011a5c8)
             [CONCAT71(in_register_00000031,room_index) & 0xffffffff] + offset;
  }
  else {
    puVar2 = state->roomdef_shadow_bytes + uVar1;
  }
  return (int)*puVar2;
}

Assistant:

int get_roomdef(tgestate_t *state, room_t room_index, int offset)
{
  int index;

  index = get_roomdef_shadow(room_index, offset);
  if (index >= 0)
    /* Get the shadow byte where present. */
    return state->roomdef_shadow_bytes[index];
  else
    /* Fetch the real byte otherwise. */
    return rooms_and_tunnels[room_index - 1][offset]; /* array starts at 1 */
}